

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

void __thiscall
spvtools::opt::CopyPropagateArrays::UpdateUses
          (CopyPropagateArrays *this,Instruction *original_ptr_inst,Instruction *new_ptr_inst)

{
  Op OVar1;
  Instruction *this_00;
  bool bVar2;
  CommonDebugInfoInstructions CVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  StorageClass storage_class;
  ConstantManager *this_01;
  Instruction *pIVar6;
  DebugInfoManager *this_02;
  Constant *this_03;
  DefUseManager *pDVar7;
  uint32_t i;
  uint32_t uVar8;
  CopyPropagateArrays *pCVar9;
  IRContext *this_04;
  pointer ppVar10;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<unsigned_int> init_list_04;
  initializer_list<unsigned_int> init_list_05;
  initializer_list<unsigned_int> init_list_06;
  initializer_list<unsigned_int> init_list_07;
  initializer_list<unsigned_int> init_list_08;
  uint local_bc;
  CopyPropagateArrays *local_b8;
  Instruction *local_b0;
  ConstantManager *local_a8;
  DefUseManager *local_a0;
  Instruction *local_98;
  TypeManager *local_90;
  pointer local_88;
  pointer local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_chain;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses;
  
  local_b0 = new_ptr_inst;
  local_90 = IRContext::get_type_mgr((this->super_MemPass).super_Pass.context_);
  this_01 = IRContext::get_constant_mgr((this->super_MemPass).super_Pass.context_);
  local_b8 = this;
  local_a0 = IRContext::get_def_use_mgr((this->super_MemPass).super_Pass.context_);
  access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&uses;
  uses.
  super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uses.
  super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uses.
  super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:645:27)>
                ::_M_manager;
  local_98 = original_ptr_inst;
  analysis::DefUseManager::ForEachUse
            (local_a0,original_ptr_inst,
             (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&access_chain);
  if (access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&access_chain,&access_chain,3);
  }
  local_80 = uses.
             super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppVar10 = uses.
            super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = this_01;
  do {
    if (ppVar10 == local_80) {
      std::
      _Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
      ::~_Vector_base(&uses.
                       super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                     );
      return;
    }
    this_00 = ppVar10->first;
    uVar8 = ppVar10->second;
    bVar2 = Instruction::IsCommonDebugInstr(this_00);
    pCVar9 = local_b8;
    if (bVar2) {
      CVar3 = Instruction::GetCommonDebugOpcode(this_00);
      pCVar9 = local_b8;
      if (CVar3 == CommonDebugInfoDebugValue) {
switchD_004cf76c_caseD_3c:
        pCVar9 = local_b8;
        IRContext::ForgetUses((local_b8->super_MemPass).super_Pass.context_,this_00);
        local_bc = Instruction::result_id(local_b0);
        init_list_00._M_len = 1;
        init_list_00._M_array = &local_bc;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain,init_list_00);
        Instruction::SetOperand(this_00,uVar8,(SmallVector<unsigned_int,_2UL> *)&access_chain);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain);
      }
      else {
        if (CVar3 != CommonDebugInfoDebugDeclare) {
          __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                        ,0x2b3,
                        "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                       );
        }
        if ((local_b0->opcode_ == OpVariable) || (local_b0->opcode_ == OpFunctionParameter)) {
          IRContext::ForgetUses((local_b8->super_MemPass).super_Pass.context_,this_00);
          local_bc = Instruction::result_id(local_b0);
          init_list._M_len = 1;
          init_list._M_array = &local_bc;
          local_88 = ppVar10;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&access_chain,init_list);
          Instruction::SetOperand(this_00,uVar8,(SmallVector<unsigned_int,_2UL> *)&access_chain);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&access_chain);
          IRContext::AnalyzeUses((pCVar9->super_MemPass).super_Pass.context_,this_00);
          ppVar10 = local_88;
          goto LAB_004cfcf5;
        }
        IRContext::ForgetUses((local_b8->super_MemPass).super_Pass.context_,this_00);
        local_bc = 0x1d;
        init_list_02._M_len = 1;
        init_list_02._M_array = &local_bc;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain,init_list_02);
        Instruction::SetOperand(this_00,uVar8 - 2,(SmallVector<unsigned_int,_2UL> *)&access_chain);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain);
        local_bc = Instruction::result_id(local_b0);
        init_list_03._M_len = 1;
        init_list_03._M_array = &local_bc;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain,init_list_03);
        Instruction::SetOperand(this_00,uVar8,(SmallVector<unsigned_int,_2UL> *)&access_chain);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain);
        uVar5 = Instruction::GetSingleWordOperand(this_00,uVar8 + 1);
        pIVar6 = analysis::DefUseManager::GetDef(local_a0,uVar5);
        this_02 = IRContext::get_debug_info_mgr((pCVar9->super_MemPass).super_Pass.context_);
        pIVar6 = analysis::DebugInfoManager::DerefDebugExpression(this_02,pIVar6);
        local_bc = Instruction::result_id(pIVar6);
        init_list_04._M_len = 1;
        init_list_04._M_array = &local_bc;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain,init_list_04);
        Instruction::SetOperand(this_00,uVar8 + 1,(SmallVector<unsigned_int,_2UL> *)&access_chain);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain);
        this_01 = local_a8;
        IRContext::AnalyzeUses((pCVar9->super_MemPass).super_Pass.context_,pIVar6);
      }
      this_04 = (pCVar9->super_MemPass).super_Pass.context_;
LAB_004cf7bd:
      IRContext::AnalyzeUses(this_04,this_00);
    }
    else {
      OVar1 = this_00->opcode_;
      switch(OVar1) {
      case OpImageTexelPointer:
      case OpDecorate:
        goto switchD_004cf76c_caseD_3c;
      case OpLoad:
        IRContext::ForgetUses((local_b8->super_MemPass).super_Pass.context_,this_00);
        pIVar6 = local_b0;
        local_bc = Instruction::result_id(local_b0);
        init_list_06._M_len = 1;
        init_list_06._M_array = &local_bc;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain,init_list_06);
        Instruction::SetOperand(this_00,uVar8,(SmallVector<unsigned_int,_2UL> *)&access_chain);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain);
        uVar8 = Instruction::type_id(pIVar6);
        pIVar6 = analysis::DefUseManager::GetDef(local_a0,uVar8);
        uVar8 = Instruction::GetSingleWordInOperand(pIVar6,1);
        uVar5 = Instruction::type_id(this_00);
        pCVar9 = local_b8;
        if (uVar8 == uVar5) {
          IRContext::AnalyzeUses((local_b8->super_MemPass).super_Pass.context_,this_00);
        }
        else {
          Instruction::SetResultType(this_00,uVar8);
          pCVar9 = local_b8;
          IRContext::AnalyzeUses((local_b8->super_MemPass).super_Pass.context_,this_00);
          UpdateUses(pCVar9,this_00,this_00);
        }
        AddUsesToWorklist(pCVar9,this_00);
        this_01 = local_a8;
        break;
      case OpStore:
        if (uVar8 == 1) {
          uVar8 = Instruction::GetSingleWordInOperand(this_00,0);
          pDVar7 = local_a0;
          pIVar6 = analysis::DefUseManager::GetDef(local_a0,uVar8);
          uVar8 = Instruction::type_id(pIVar6);
          pIVar6 = analysis::DefUseManager::GetDef(pDVar7,uVar8);
          uVar8 = Instruction::GetSingleWordInOperand(pIVar6,1);
          uVar8 = Pass::GenerateCopy((Pass *)pCVar9,local_98,uVar8,this_00);
          if (uVar8 == 0) {
            __assert_fail("copy != 0 && \"Should not be updating uses unless we know it can be done.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                          ,0x329,
                          "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                         );
          }
          IRContext::ForgetUses((pCVar9->super_MemPass).super_Pass.context_,this_00);
          init_list_07._M_len = 1;
          init_list_07._M_array = &local_bc;
          local_bc = uVar8;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&access_chain,init_list_07);
          Instruction::SetInOperand(this_00,1,(SmallVector<unsigned_int,_2UL> *)&access_chain);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&access_chain);
          this_04 = (pCVar9->super_MemPass).super_Pass.context_;
          goto LAB_004cf7bd;
        }
        break;
      case OpCopyMemory:
      case OpCopyMemorySized:
      case OpInBoundsAccessChain:
      case OpPtrAccessChain:
      case OpArrayLength:
      case OpGenericPtrMemSemantics:
      case OpInBoundsPtrAccessChain:
switchD_004cf76c_caseD_3f:
        __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                      ,0x33b,
                      "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                     );
      case OpAccessChain:
        IRContext::ForgetUses((local_b8->super_MemPass).super_Pass.context_,this_00);
        local_bc = Instruction::result_id(local_b0);
        init_list_05._M_len = 1;
        init_list_05._M_array = &local_bc;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain,init_list_05);
        Instruction::SetOperand(this_00,uVar8,(SmallVector<unsigned_int,_2UL> *)&access_chain);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&access_chain);
        access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (uVar8 = 1; uVar5 = Instruction::NumInOperands(this_00), pCVar9 = local_b8,
            uVar8 < uVar5; uVar8 = uVar8 + 1) {
          uVar5 = Instruction::GetSingleWordInOperand(this_00,uVar8);
          this_03 = analysis::ConstantManager::FindDeclaredConstant(this_01,uVar5);
          if (this_03 == (Constant *)0x0) {
            local_bc = 0;
          }
          else {
            local_bc = analysis::Constant::GetU32(this_03);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (&access_chain,&local_bc);
        }
        pDVar7 = Pass::get_def_use_mgr((Pass *)local_b8);
        uVar8 = Instruction::type_id(local_b0);
        pIVar6 = analysis::DefUseManager::GetDef(pDVar7,uVar8);
        uVar8 = Instruction::GetSingleWordInOperand(pIVar6,1);
        uVar8 = GetMemberTypeId(pCVar9,uVar8,&access_chain);
        storage_class = Instruction::GetSingleWordInOperand(pIVar6,0);
        uVar8 = analysis::TypeManager::FindPointerToType(local_90,uVar8,storage_class);
        uVar5 = Instruction::type_id(this_00);
        if (uVar8 == uVar5) {
          IRContext::AnalyzeUses((pCVar9->super_MemPass).super_Pass.context_,this_00);
        }
        else {
          Instruction::SetResultType(this_00,uVar8);
          IRContext::AnalyzeUses((pCVar9->super_MemPass).super_Pass.context_,this_00);
          UpdateUses(pCVar9,this_00,this_00);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&access_chain);
        this_01 = local_a8;
        break;
      default:
        if (OVar1 == OpExtInst) {
          bVar2 = IsInterpolationInstruction(local_b8,this_00);
          if (!bVar2) {
            __assert_fail("false && \"Don\'t know how to rewrite instruction\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                          ,0x2d5,
                          "void spvtools::opt::CopyPropagateArrays::UpdateUses(Instruction *, Instruction *)"
                         );
          }
          IRContext::ForgetUses((pCVar9->super_MemPass).super_Pass.context_,this_00);
          local_bc = Instruction::result_id(local_b0);
          init_list_08._M_len = 1;
          init_list_08._M_array = &local_bc;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&access_chain,init_list_08);
          Instruction::SetOperand(this_00,uVar8,(SmallVector<unsigned_int,_2UL> *)&access_chain);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&access_chain);
          IRContext::AnalyzeUses((pCVar9->super_MemPass).super_Pass.context_,this_00);
          this_01 = local_a8;
        }
        else {
          if (OVar1 != OpCompositeExtract) goto switchD_004cf76c_caseD_3f;
          IRContext::ForgetUses((local_b8->super_MemPass).super_Pass.context_,this_00);
          pIVar6 = local_b0;
          local_bc = Instruction::result_id(local_b0);
          init_list_01._M_len = 1;
          init_list_01._M_array = &local_bc;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&access_chain,init_list_01);
          Instruction::SetOperand(this_00,uVar8,(SmallVector<unsigned_int,_2UL> *)&access_chain);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&access_chain);
          uVar5 = Instruction::type_id(pIVar6);
          access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          access_chain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (uVar8 = 1; uVar4 = Instruction::NumInOperands(this_00), pCVar9 = local_b8,
              uVar8 < uVar4; uVar8 = uVar8 + 1) {
            local_bc = Instruction::GetSingleWordInOperand(this_00,uVar8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&access_chain,&local_bc);
          }
          uVar8 = GetMemberTypeId(local_b8,uVar5,&access_chain);
          uVar5 = Instruction::type_id(this_00);
          if (uVar8 == uVar5) {
            IRContext::AnalyzeUses((pCVar9->super_MemPass).super_Pass.context_,this_00);
          }
          else {
            Instruction::SetResultType(this_00,uVar8);
            IRContext::AnalyzeUses((pCVar9->super_MemPass).super_Pass.context_,this_00);
            UpdateUses(pCVar9,this_00,this_00);
          }
          this_01 = local_a8;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&access_chain);
        }
      }
    }
LAB_004cfcf5:
    ppVar10 = ppVar10 + 1;
  } while( true );
}

Assistant:

void CopyPropagateArrays::UpdateUses(Instruction* original_ptr_inst,
                                     Instruction* new_ptr_inst) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  std::vector<std::pair<Instruction*, uint32_t> > uses;
  def_use_mgr->ForEachUse(original_ptr_inst,
                          [&uses](Instruction* use, uint32_t index) {
                            uses.push_back({use, index});
                          });

  for (auto pair : uses) {
    Instruction* use = pair.first;
    uint32_t index = pair.second;

    if (use->IsCommonDebugInstr()) {
      switch (use->GetCommonDebugOpcode()) {
        case CommonDebugInfoDebugDeclare: {
          if (new_ptr_inst->opcode() == spv::Op::OpVariable ||
              new_ptr_inst->opcode() == spv::Op::OpFunctionParameter) {
            context()->ForgetUses(use);
            use->SetOperand(index, {new_ptr_inst->result_id()});
            context()->AnalyzeUses(use);
          } else {
            // Based on the spec, we cannot use a pointer other than OpVariable
            // or OpFunctionParameter for DebugDeclare. We have to use
            // DebugValue with Deref.

            context()->ForgetUses(use);

            // Change DebugDeclare to DebugValue.
            use->SetOperand(index - 2,
                            {static_cast<uint32_t>(CommonDebugInfoDebugValue)});
            use->SetOperand(index, {new_ptr_inst->result_id()});

            // Add Deref operation.
            Instruction* dbg_expr =
                def_use_mgr->GetDef(use->GetSingleWordOperand(index + 1));
            auto* deref_expr_instr =
                context()->get_debug_info_mgr()->DerefDebugExpression(dbg_expr);
            use->SetOperand(index + 1, {deref_expr_instr->result_id()});

            context()->AnalyzeUses(deref_expr_instr);
            context()->AnalyzeUses(use);
          }
          break;
        }
        case CommonDebugInfoDebugValue:
          context()->ForgetUses(use);
          use->SetOperand(index, {new_ptr_inst->result_id()});
          context()->AnalyzeUses(use);
          break;
        default:
          assert(false && "Don't know how to rewrite instruction");
          break;
      }
      continue;
    }

    switch (use->opcode()) {
      case spv::Op::OpLoad: {
        // Replace the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        // Update the type.
        Instruction* pointer_type_inst =
            def_use_mgr->GetDef(new_ptr_inst->type_id());
        uint32_t new_type_id =
            pointer_type_inst->GetSingleWordInOperand(kTypePointerPointeeInIdx);
        if (new_type_id != use->type_id()) {
          use->SetResultType(new_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }

        AddUsesToWorklist(use);
      } break;
      case spv::Op::OpExtInst: {
        if (IsInterpolationInstruction(use)) {
          // Replace the actual use.
          context()->ForgetUses(use);
          use->SetOperand(index, {new_ptr_inst->result_id()});
          context()->AnalyzeUses(use);
        } else {
          assert(false && "Don't know how to rewrite instruction");
        }
      } break;
      case spv::Op::OpAccessChain: {
        // Update the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        // Convert the ids on the OpAccessChain to indices that can be used to
        // get the specific member.
        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          const analysis::Constant* index_const =
              const_mgr->FindDeclaredConstant(use->GetSingleWordInOperand(i));
          if (index_const) {
            access_chain.push_back(index_const->GetU32());
          } else {
            // Variable index means the type is an type where every element
            // is the same type.  Use element 0 to get the type.
            access_chain.push_back(0);
          }
        }

        Instruction* pointer_type_inst =
            get_def_use_mgr()->GetDef(new_ptr_inst->type_id());

        uint32_t new_pointee_type_id = GetMemberTypeId(
            pointer_type_inst->GetSingleWordInOperand(kTypePointerPointeeInIdx),
            access_chain);

        spv::StorageClass storage_class = static_cast<spv::StorageClass>(
            pointer_type_inst->GetSingleWordInOperand(
                kTypePointerStorageClassInIdx));

        uint32_t new_pointer_type_id =
            type_mgr->FindPointerToType(new_pointee_type_id, storage_class);

        if (new_pointer_type_id != use->type_id()) {
          use->SetResultType(new_pointer_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }
      } break;
      case spv::Op::OpCompositeExtract: {
        // Update the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});

        uint32_t new_type_id = new_ptr_inst->type_id();
        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          access_chain.push_back(use->GetSingleWordInOperand(i));
        }

        new_type_id = GetMemberTypeId(new_type_id, access_chain);

        if (new_type_id != use->type_id()) {
          use->SetResultType(new_type_id);
          context()->AnalyzeUses(use);
          UpdateUses(use, use);
        } else {
          context()->AnalyzeUses(use);
        }
      } break;
      case spv::Op::OpStore:
        // If the use is the pointer, then it is the single store to that
        // variable.  We do not want to replace it.  Instead, it will become
        // dead after all of the loads are removed, and ADCE will get rid of it.
        //
        // If the use is the object being stored, we will create a copy of the
        // object turning it into the correct type. The copy is done by
        // decomposing the object into the base type, which must be the same,
        // and then rebuilding them.
        if (index == 1) {
          Instruction* target_pointer = def_use_mgr->GetDef(
              use->GetSingleWordInOperand(kStorePointerInOperand));
          Instruction* pointer_type =
              def_use_mgr->GetDef(target_pointer->type_id());
          uint32_t pointee_type_id =
              pointer_type->GetSingleWordInOperand(kTypePointerPointeeInIdx);
          uint32_t copy = GenerateCopy(original_ptr_inst, pointee_type_id, use);
          assert(copy != 0 &&
                 "Should not be updating uses unless we know it can be done.");

          context()->ForgetUses(use);
          use->SetInOperand(index, {copy});
          context()->AnalyzeUses(use);
        }
        break;
      case spv::Op::OpDecorate:
      // We treat an OpImageTexelPointer as a load.  The result type should
      // always have the Image storage class, and should not need to be
      // updated.
      case spv::Op::OpImageTexelPointer:
        // Replace the actual use.
        context()->ForgetUses(use);
        use->SetOperand(index, {new_ptr_inst->result_id()});
        context()->AnalyzeUses(use);
        break;
      default:
        assert(false && "Don't know how to rewrite instruction");
        break;
    }
  }
}